

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall
IRBuilder::BuildElementSlot
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot fieldRegSlot,RegSlot regSlot,
          int32 slotId,ProfileId profileId)

{
  undefined1 *puVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  PropertyKind propertyKind;
  byte bVar5;
  DWORD DVar6;
  undefined4 *puVar7;
  JITTimeFunctionBody *this_00;
  FunctionInfoPtrPtr address;
  AddrOpnd *src1Opnd;
  SymOpnd *pSVar8;
  StackSym *sym;
  RegOpnd *src2Opnd;
  PropertySym *sym_00;
  RegOpnd *pRVar9;
  Instr *pIVar10;
  RegOpnd *pRVar11;
  IntConstOpnd *pIVar12;
  RegOpnd *pRVar13;
  Opnd *pOVar14;
  Func *pFVar15;
  OpCode local_50;
  uint32 local_38;
  bool local_31 [8];
  bool isLdSlotThatWasNotProfiled;
  
  bVar4 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0xd74,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar4) goto LAB_004d6792;
    *puVar7 = 0;
  }
  local_31[0] = false;
  sym = (StackSym *)0x0;
  local_38 = offset;
  if (newOpcode < NewInnerScFunc) {
    if (newOpcode < LdObjSlot) {
      propertyKind = PropertyKindSlots;
      if (newOpcode != LdSlot) {
        if (newOpcode == NewScFuncHomeObj) goto switchD_004d5fb7_caseD_169;
        goto switchD_004d5fb7_default;
      }
LAB_004d61a8:
      pSVar8 = BuildFieldOpnd(this,newOpcode,fieldRegSlot,slotId,0xffffffff,propertyKind,0xffffffff)
      ;
    }
    else {
      if (newOpcode == LdObjSlot) {
        newOpcode = LdSlot;
      }
      else if (newOpcode == StObjSlot) {
        sym = (StackSym *)&DAT_00000001;
        newOpcode = StSlot;
      }
      else {
        if (newOpcode != StObjSlotChkUndecl) goto switchD_004d5fb7_default;
        sym = (StackSym *)&DAT_00000001;
        newOpcode = StSlotChkUndecl;
      }
      pRVar9 = IR::RegOpnd::New(TyVar,this->m_func);
      DVar6 = Js::DynamicObject::GetOffsetOfAuxSlots();
      pSVar8 = BuildFieldOpnd(this,newOpcode,fieldRegSlot,DVar6 >> 3,0xffffffff,
                              PropertyKindSlotArray,0xffffffff);
      pIVar10 = IR::Instr::New(LdSlotArr,&pRVar9->super_Opnd,&pSVar8->super_Opnd,this->m_func);
      AddInstr(this,pIVar10,offset);
      sym_00 = PropertySym::New(pRVar9->m_sym,slotId,0xffffffff,0xffffffff,PropertyKindSlots,
                                this->m_func);
      pSVar8 = IR::SymOpnd::New(&sym_00->super_Sym,TyVar,this->m_func);
      if ((char)sym != '\0') {
LAB_004d6390:
        pRVar9 = BuildSrcOpnd(this,regSlot,TyVar);
        pIVar10 = IR::Instr::New(newOpcode,&pSVar8->super_Opnd,&pRVar9->super_Opnd,this->m_func);
        if (newOpcode == StSlotChkUndecl) {
          if (pIVar10->m_src2 != (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src."
                              );
            if (!bVar4) goto LAB_004d6792;
            *puVar7 = 0;
          }
          pFVar15 = pIVar10->m_func;
          if ((pSVar8->super_Opnd).isDeleted == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x14,"(!isDeleted)","Using deleted operand");
            if (!bVar4) goto LAB_004d6792;
            *puVar7 = 0;
          }
          bVar5 = (pSVar8->super_Opnd).field_0xb;
          if ((bVar5 & 2) != 0) {
            pSVar8 = (SymOpnd *)IR::Opnd::Copy(&pSVar8->super_Opnd,pFVar15);
            bVar5 = (pSVar8->super_Opnd).field_0xb;
          }
          (pSVar8->super_Opnd).field_0xb = bVar5 | 2;
          pIVar10->m_src2 = &pSVar8->super_Opnd;
        }
        goto LAB_004d66f0;
      }
    }
    pIVar10 = (Instr *)0x0;
    pRVar9 = BuildDstOpnd(this,regSlot,TyVar,false,false);
    if (profileId != 0xffff) {
      pIVar10 = BuildProfiledSlotLoad(this,newOpcode,pRVar9,pSVar8,profileId,local_31);
    }
    if (pIVar10 == (Instr *)0x0) {
      pIVar10 = IR::Instr::New(newOpcode,&pRVar9->super_Opnd,&pSVar8->super_Opnd,this->m_func);
    }
LAB_004d66f0:
    AddInstr(this,pIVar10,local_38);
    if ((local_31[0] == true) && (bVar4 = DoBailOnNoProfile(this), bVar4)) {
      InsertBailOnNoProfile(this,pIVar10);
      return;
    }
    return;
  }
  if (newOpcode < StPropIdArrFromVar) {
    switch(newOpcode) {
    case NewInnerScFunc:
      local_50 = NewScFunc;
      break;
    case NewInnerScGenFunc:
      local_50 = NewScGenFunc;
      sym = (StackSym *)0x0;
      break;
    case NewInnerStackScFunc:
      local_50 = NewScFunc;
      sym = EnsureStackFuncPtrSym(this);
      break;
    case NewScGenFuncHomeObj:
switchD_004d5fb7_caseD_169:
      this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      address = JITTimeFunctionBody::GetNestedFuncRef(this_00,slotId);
      src1Opnd = IR::AddrOpnd::New(address,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0);
      pOVar14 = GetEnvironmentOperand(this,offset);
      pRVar9 = BuildSrcOpnd(this,fieldRegSlot,TyVar);
      pRVar11 = BuildDstOpnd(this,regSlot,TyVar,false,false);
      pRVar13 = IR::RegOpnd::New(TyVar,this->m_func);
      pIVar10 = IR::Instr::New(ExtendArg_A,&pRVar13->super_Opnd,&pRVar9->super_Opnd,this->m_func);
      AddInstr(this,pIVar10,offset);
      pRVar9 = IR::RegOpnd::New(TyVar,this->m_func);
      pIVar10 = IR::Instr::New(ExtendArg_A,&pRVar9->super_Opnd,&src1Opnd->super_Opnd,pIVar10->m_dst,
                               this->m_func);
      AddInstr(this,pIVar10,offset);
      pRVar9 = IR::RegOpnd::New(TyVar,this->m_func);
      pIVar10 = IR::Instr::New(ExtendArg_A,&pRVar9->super_Opnd,pOVar14,pIVar10->m_dst,this->m_func);
      AddInstr(this,pIVar10,offset);
      pIVar10 = IR::Instr::New(newOpcode,&pRVar11->super_Opnd,pIVar10->m_dst,this->m_func);
      goto LAB_004d62b9;
    default:
      goto switchD_004d5fb7_default;
    }
    pIVar12 = IR::IntConstOpnd::New((long)slotId,TyInt32,this->m_func,true);
    pRVar9 = BuildSrcOpnd(this,fieldRegSlot,TyVar);
    pRVar11 = BuildDstOpnd(this,regSlot,TyVar,false,false);
    pFVar15 = this->m_func;
    if (sym != (StackSym *)0x0) {
      pRVar13 = IR::RegOpnd::New(TyVar,pFVar15);
      src2Opnd = IR::RegOpnd::New(sym,TyVar,this->m_func);
      pIVar10 = IR::Instr::New(NewScFuncData,&pRVar13->super_Opnd,&pRVar9->super_Opnd,
                               &src2Opnd->super_Opnd,this->m_func);
      AddInstr(this,pIVar10,offset);
      pFVar15 = this->m_func;
      pRVar9 = pRVar13;
    }
    pIVar10 = IR::Instr::New(local_50,&pRVar11->super_Opnd,&pIVar12->super_Opnd,&pRVar9->super_Opnd,
                             pFVar15);
LAB_004d62b9:
    uVar2 = *(uint *)&pRVar11->m_sym->field_0x18;
    if ((uVar2 & 1) != 0) {
      *(uint *)&pRVar11->m_sym->field_0x18 = uVar2 | 4;
      puVar1 = &pRVar11->m_sym->field_0x18;
      *(uint *)puVar1 = *(uint *)puVar1 | 2;
    }
    AddInstr(this,pIVar10,offset);
    return;
  }
  if (newOpcode - 0x1f7 < 2) {
    pSVar8 = BuildFieldOpnd(this,newOpcode,fieldRegSlot,slotId,0xffffffff,PropertyKindSlots,
                            0xffffffff);
    goto LAB_004d6390;
  }
  if (newOpcode == StPropIdArrFromVar) {
    pRVar9 = BuildSrcOpnd(this,fieldRegSlot,TyVar);
    pRVar11 = BuildSrcOpnd(this,regSlot,TyVar);
    pIVar12 = IR::IntConstOpnd::New((long)slotId,TyInt32,this->m_func,false);
    pRVar13 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar10 = IR::Instr::New(ExtendArg_A,&pRVar13->super_Opnd,&pRVar11->super_Opnd,this->m_func);
    AddInstr(this,pIVar10,offset);
    pRVar11 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar10 = IR::Instr::New(ExtendArg_A,&pRVar11->super_Opnd,&pIVar12->super_Opnd,pIVar10->m_dst,
                             this->m_func);
    AddInstr(this,pIVar10,0xffffffff);
    pRVar11 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar10 = IR::Instr::New(ExtendArg_A,&pRVar11->super_Opnd,&pRVar9->super_Opnd,pIVar10->m_dst,
                             this->m_func);
    AddInstr(this,pIVar10,0xffffffff);
    pOVar14 = pIVar10->m_dst;
    pIVar10 = IR::Instr::New(StPropIdArrFromVar,this->m_func);
    if (pIVar10->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_004d6792;
      *puVar7 = 0;
    }
    pFVar15 = pIVar10->m_func;
    if (pOVar14->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) goto LAB_004d6792;
      *puVar7 = 0;
    }
    bVar5 = pOVar14->field_0xb;
    if ((bVar5 & 2) != 0) {
      pOVar14 = IR::Opnd::Copy(pOVar14,pFVar15);
      bVar5 = pOVar14->field_0xb;
    }
    pOVar14->field_0xb = bVar5 | 2;
    pIVar10->m_src1 = pOVar14;
    local_38 = 0xffffffff;
    goto LAB_004d66f0;
  }
  if (newOpcode == LdSlotArr) {
    propertyKind = PropertyKindSlotArray;
    goto LAB_004d61a8;
  }
switchD_004d5fb7_default:
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar7 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                     ,0xe17,"((0))","Unknown ElementSlot opcode");
  if (bVar4) {
    *puVar7 = 0;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_004d6792:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void
IRBuilder::BuildElementSlot(Js::OpCode newOpcode, uint32 offset, Js::RegSlot fieldRegSlot, Js::RegSlot regSlot,
    int32 slotId, Js::ProfileId profileId)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    IR::Instr *     instr;
    IR::RegOpnd * regOpnd;

    IR::SymOpnd *   fieldSymOpnd;
    PropertyKind    propertyKind = PropertyKindSlots;
    PropertySym *   fieldSym;
    StackSym *      stackFuncPtrSym = nullptr;
    bool isLdSlotThatWasNotProfiled = false;

    switch (newOpcode)
    {
    case Js::OpCode::NewInnerStackScFunc:
        stackFuncPtrSym = this->EnsureStackFuncPtrSym();
        // fall through
    case Js::OpCode::NewInnerScFunc:
        newOpcode = Js::OpCode::NewScFunc;
        goto NewScFuncCommon;

    case Js::OpCode::NewInnerScGenFunc:
        newOpcode = Js::OpCode::NewScGenFunc;
NewScFuncCommon:
    {
        IR::Opnd * functionBodySlotOpnd = IR::IntConstOpnd::New(slotId, TyInt32, m_func, true);
        IR::Opnd * environmentOpnd = this->BuildSrcOpnd(fieldRegSlot);
        regOpnd = this->BuildDstOpnd(regSlot);
        if (stackFuncPtrSym)
        {
             IR::RegOpnd * dataOpnd = IR::RegOpnd::New(TyVar, m_func);
             instr = IR::Instr::New(Js::OpCode::NewScFuncData, dataOpnd, environmentOpnd, IR::RegOpnd::New(stackFuncPtrSym, TyVar, m_func), m_func);
             this->AddInstr(instr, offset);

            instr = IR::Instr::New(newOpcode, regOpnd, functionBodySlotOpnd, dataOpnd, m_func);
        }
        else
        {
            instr = IR::Instr::New(newOpcode, regOpnd, functionBodySlotOpnd, environmentOpnd, m_func);
        }
        if (regOpnd->m_sym->m_isSingleDef)
        {
            regOpnd->m_sym->m_isSafeThis = true;
            regOpnd->m_sym->m_isNotNumber = true;
        }
        this->AddInstr(instr, offset);
        return;
    }

    case Js::OpCode::NewScFuncHomeObj:
    case Js::OpCode::NewScGenFuncHomeObj:
    {
        Js::FunctionInfoPtrPtr infoRef = m_func->GetJITFunctionBody()->GetNestedFuncRef(slotId);
        IR::AddrOpnd * functionBodySlotOpnd = IR::AddrOpnd::New((Js::Var)infoRef, IR::AddrOpndKindDynamicMisc, m_func);
        IR::Opnd * environmentOpnd = GetEnvironmentOperand(offset);
        IR::Opnd * homeObjOpnd = this->BuildSrcOpnd(fieldRegSlot);
        regOpnd = this->BuildDstOpnd(regSlot);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), homeObjOpnd, m_func);
        this->AddInstr(instr, offset);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), functionBodySlotOpnd, instr->GetDst(), m_func);
        this->AddInstr(instr, offset);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), environmentOpnd, instr->GetDst(), m_func);
        this->AddInstr(instr, offset);

        instr = IR::Instr::New(newOpcode, regOpnd, instr->GetDst(), m_func);

        if (regOpnd->m_sym->m_isSingleDef)
        {
            regOpnd->m_sym->m_isSafeThis = true;
            regOpnd->m_sym->m_isNotNumber = true;
        }
        this->AddInstr(instr, offset);
        return;
    }

    case Js::OpCode::LdObjSlot:
        newOpcode = Js::OpCode::LdSlot;
        goto ObjSlotCommon;

    case Js::OpCode::StObjSlot:
        newOpcode = Js::OpCode::StSlot;
        goto ObjSlotCommon;

    case Js::OpCode::StObjSlotChkUndecl:
        newOpcode = Js::OpCode::StSlotChkUndecl;

ObjSlotCommon:
        regOpnd = IR::RegOpnd::New(TyVar, m_func);
        fieldSymOpnd = this->BuildFieldOpnd(newOpcode, fieldRegSlot, (Js::DynamicObject::GetOffsetOfAuxSlots())/sizeof(Js::Var), (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);
        instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldSymOpnd, m_func);
        this->AddInstr(instr, offset);

        fieldSym = PropertySym::New(regOpnd->m_sym, slotId, (uint32)-1, (uint)-1, PropertyKindSlots, m_func);
        fieldSymOpnd = IR::SymOpnd::New(fieldSym, TyVar, m_func);

        if (newOpcode == Js::OpCode::StSlot || newOpcode == Js::OpCode::StSlotChkUndecl)
        {
            goto StSlotCommon;
        }
        goto LdSlotCommon;

    case Js::OpCode::LdSlotArr:
        propertyKind = PropertyKindSlotArray;
    case Js::OpCode::LdSlot:
        // Load
        fieldSymOpnd = this->BuildFieldOpnd(newOpcode, fieldRegSlot, slotId, (Js::PropertyIdIndexType)-1, propertyKind);

LdSlotCommon:
        regOpnd = this->BuildDstOpnd(regSlot);

        instr = nullptr;
        if (profileId != Js::Constants::NoProfileId)
        {
            instr = this->BuildProfiledSlotLoad(newOpcode, regOpnd, fieldSymOpnd, profileId, &isLdSlotThatWasNotProfiled);
        }
        if (!instr)
        {
            instr = IR::Instr::New(newOpcode, regOpnd, fieldSymOpnd, m_func);
        }
        break;

    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
        // Store
        fieldSymOpnd = this->BuildFieldOpnd(newOpcode, fieldRegSlot, slotId, (Js::PropertyIdIndexType)-1, propertyKind);

StSlotCommon:
        regOpnd = this->BuildSrcOpnd(regSlot);

        instr = IR::Instr::New(newOpcode, fieldSymOpnd, regOpnd, m_func);
        if (newOpcode == Js::OpCode::StSlotChkUndecl)
        {
            // ChkUndecl includes an implicit read of the destination. Communicate the liveness by using the destination in src2.
            instr->SetSrc2(fieldSymOpnd);
        }
        break;

    case Js::OpCode::StPropIdArrFromVar:
    {
        IR::RegOpnd *   src0Opnd = this->BuildSrcOpnd(fieldRegSlot);
        IR::RegOpnd *   src1Opnd = this->BuildSrcOpnd(regSlot);
        IntConstType    value = slotId;
        IR::IntConstOpnd * valOpnd = IR::IntConstOpnd::New(value, TyInt32, m_func);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src1Opnd, m_func);
        this->AddInstr(instr, offset);
        offset = Js::Constants::NoByteCodeOffset;

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), valOpnd, instr->GetDst(), m_func);
        this->AddInstr(instr, offset);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src0Opnd, instr->GetDst(), m_func);
        this->AddInstr(instr, offset);

        IR::Opnd * firstArg = instr->GetDst();
        instr = IR::Instr::New(newOpcode, m_func);
        instr->SetSrc1(firstArg);
        break;
    }

    default:
        AssertMsg(UNREACHED, "Unknown ElementSlot opcode");
        Fatal();
    }

    this->AddInstr(instr, offset);

    if(isLdSlotThatWasNotProfiled && DoBailOnNoProfile())
    {
        InsertBailOnNoProfile(instr);
    }
}